

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O2

_Bool next_value_greater_than_reporting_level_upper_bound
                (hdr_iter *iter,int64_t reporting_level_upper_bound)

{
  bool bVar1;
  int64_t iVar2;
  
  if (iter->counts_index < iter->h->counts_len) {
    iVar2 = hdr_value_at_index(iter->h,iter->counts_index + 1);
    bVar1 = reporting_level_upper_bound < iVar2;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool next_value_greater_than_reporting_level_upper_bound(
    struct hdr_iter *iter, int64_t reporting_level_upper_bound)
{
    if (iter->counts_index >= iter->h->counts_len)
    {
        return false;
    }

    return peek_next_value_from_index(iter) > reporting_level_upper_bound;
}